

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O2

Url * __thiscall
Vault::KeyValue::getMetadataUrl(Url *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pCVar1 = this->client_;
  Vault::operator+(&local_40,"/v1/",&this->mount_);
  std::operator+(&local_60,&local_40,"/metadata/");
  (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,&local_60,path);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::KeyValue::getMetadataUrl(const Vault::Path &path) {
  return Vault::Url{client_.getUrl("/v1/" + mount_ + "/metadata/", path)};
}